

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_subscript(CTcPrsNode *lhs)

{
  CTcPrsNode *subscript;
  CTcPrsNode *pCVar1;
  
  CTcTokenizer::next(G_tok);
  subscript = CTcPrsOpBin::parse(&S_op_comma.super_CTcPrsOpBin);
  if (subscript == (CTcPrsNode *)0x0) {
    pCVar1 = (CTcPrsNode *)0x0;
  }
  else {
    if ((G_tok->curtok_).typ_ == TOKT_RBRACK) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b0a);
    }
    pCVar1 = eval_const_subscript(lhs,subscript);
    if (pCVar1 == (CTcPrsNode *)0x0) {
      pCVar1 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
      pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lhs;
      pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subscript;
      (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0035a7b0;
    }
  }
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_subscript(CTcPrsNode *lhs)
{
    /* skip the '[' */
    G_tok->next();

    /* parse the expression within the brackets */
    CTcPrsNode *subscript = S_op_comma.parse();
    if (subscript == 0)
        return 0;

    /* check for the matching ']' */
    if (G_tok->cur() == TOKT_RBRACK)
    {
        /* got it - skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and forgive the missing ']' */
        G_tok->log_error_curtok(TCERR_EXPECTED_SUB_RBRACK);
    }

    /* try folding constants */
    CTcPrsNode *cval = eval_const_subscript(lhs, subscript);

    /* 
     *   if that worked, use the result; otherwise, build an expression
     *   node to generate code for the subscript operator
     */
    if (cval != 0)
        return cval;
    else
        return new CTPNSubscript(lhs, subscript);
}